

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O3

void avro::codec_traits<std::vector<double,_std::allocator<double>_>_>::decode
               (Decoder *d,vector<double,_std::allocator<double>_> *s)

{
  pointer pdVar1;
  iterator __position;
  double in_RAX;
  long lVar2;
  double t;
  double local_28;
  
  pdVar1 = (s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    (s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  local_28 = in_RAX;
  lVar2 = (**(code **)(*(long *)d + 0x80))(d);
  while (lVar2 != 0) {
    do {
      local_28 = (double)(**(code **)(*(long *)d + 0x40))(d);
      __position._M_current =
           (s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)s,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        (s->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    lVar2 = (**(code **)(*(long *)d + 0x88))(d);
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::vector<T>& s) {
        s.clear();
        for (size_t n = d.arrayStart(); n != 0; n = d.arrayNext()) {
            for (size_t i = 0; i < n; ++i) {
                T t;
                avro::decode(d, t);
                s.push_back(t);
            }
        }
    }